

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

void idx2::InsertionSort<idx2::t2<unsigned_int,idx2::channel*>*>
               (t2<unsigned_int,_idx2::channel_*> *Beg,t2<unsigned_int,_idx2::channel_*> *End)

{
  channel *pcVar1;
  channel *pcVar2;
  undefined4 uVar3;
  uint uVar4;
  undefined4 uVar5;
  t2<unsigned_int,_idx2::channel_*> *ptVar6;
  t2<unsigned_int,_idx2::channel_*> *ptVar7;
  t2<unsigned_int,_idx2::channel_*> *End_00;
  
  End_00 = Beg;
  if (Beg != End) {
    while (End_00 = End_00 + 1, End_00 != End) {
      ptVar6 = BinarySearch<idx2::t2<unsigned_int,idx2::channel*>,idx2::t2<unsigned_int,idx2::channel*>*>
                         (Beg,End_00,End_00);
      for (ptVar7 = End_00; ptVar7 != ptVar6; ptVar7 = ptVar7 + -1) {
        uVar4 = ptVar7->First;
        uVar5 = *(undefined4 *)&ptVar7->field_0x4;
        pcVar1 = ptVar7->Second;
        uVar3 = *(undefined4 *)&ptVar7[-1].field_0x4;
        pcVar2 = ptVar7[-1].Second;
        ptVar7->First = ptVar7[-1].First;
        *(undefined4 *)&ptVar7->field_0x4 = uVar3;
        ptVar7->Second = pcVar2;
        ptVar7[-1].First = uVar4;
        *(undefined4 *)&ptVar7[-1].field_0x4 = uVar5;
        ptVar7[-1].Second = pcVar1;
      }
    }
  }
  return;
}

Assistant:

void
InsertionSort(i Beg, i End)
{
  if (Beg == End)
    return;
  i Last = Beg + 1;
  while (Last != End)
  {
    i Pos = BinarySearch(Beg, Last, *Last);
    for (i It = Last; It != Pos; --It)
      Swap(It, It - 1);
    ++Last;
  }
}